

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall
Parser::ParseDestructuredLiteralWithScopeSave
          (Parser *this,tokens declarationType,bool isDecl,bool topLevel,
          DestructuringInitializerContext initializerContext,bool allowIn)

{
  charcount_t cVar1;
  uint uVar2;
  uint funcInArrayDepthSave;
  charcount_t funcInArraySave;
  uint newTempNestedCount;
  int32 newTempAstSize;
  ParseNodePtr newTempScope;
  ParseNodePtr *ppnodeExprScopeSave;
  ParseNodePtr *ppnodeScopeSave;
  uint *pNestedCountSave;
  int32 *pAstSizeSave;
  ParseNodeFnc *pnodeDeferredFncSave;
  ParseNodeFnc *pnodeFncSave;
  undefined1 local_16;
  bool allowIn_local;
  DestructuringInitializerContext initializerContext_local;
  bool topLevel_local;
  bool isDecl_local;
  Parser *pPStack_10;
  tokens declarationType_local;
  Parser *this_local;
  
  pnodeDeferredFncSave = this->m_currentNodeFunc;
  pAstSizeSave = (int32 *)this->m_currentNodeDeferredFunc;
  if (this->m_currentNodeDeferredFunc == (ParseNodeFnc *)0x0) {
    this->m_currentNodeDeferredFunc = this->m_currentNodeFunc;
  }
  pNestedCountSave = (uint *)this->m_pCurrentAstSize;
  ppnodeScopeSave = (ParseNodePtr *)this->m_pnestedCount;
  ppnodeExprScopeSave = this->m_ppnodeScope;
  newTempScope = (ParseNodePtr)this->m_ppnodeExprScope;
  _newTempNestedCount = (ParseNodePtr)0x0;
  this->m_ppnodeScope = (ParseNodePtr *)&newTempNestedCount;
  funcInArraySave = 0;
  this->m_pCurrentAstSize = (int32 *)&funcInArraySave;
  funcInArrayDepthSave = 0;
  this->m_pnestedCount = &funcInArrayDepthSave;
  this->m_ppnodeExprScope = (ParseNodePtr *)0x0;
  cVar1 = this->m_funcInArray;
  uVar2 = this->m_funcInArrayDepth;
  this->m_hasDeferredShorthandInitError = false;
  pnodeFncSave._3_1_ = allowIn;
  pnodeFncSave._4_4_ = initializerContext;
  local_16 = topLevel;
  allowIn_local = isDecl;
  initializerContext_local = declarationType;
  pPStack_10 = this;
  ParseDestructuredLiteral<false>
            (this,declarationType,isDecl,topLevel,initializerContext,allowIn,(BOOL *)0x0,(BOOL *)0x0
            );
  this->m_currentNodeFunc = pnodeDeferredFncSave;
  this->m_currentNodeDeferredFunc = (ParseNodeFnc *)pAstSizeSave;
  this->m_pCurrentAstSize = (int32 *)pNestedCountSave;
  this->m_pnestedCount = (uint *)ppnodeScopeSave;
  this->m_ppnodeScope = ppnodeExprScopeSave;
  this->m_ppnodeExprScope = (ParseNodePtr *)newTempScope;
  this->m_funcInArray = cVar1;
  this->m_funcInArrayDepth = uVar2;
  return;
}

Assistant:

void Parser::ParseDestructuredLiteralWithScopeSave(tokens declarationType,
    bool isDecl,
    bool topLevel,
    DestructuringInitializerContext initializerContext/* = DIC_None*/,
    bool allowIn /*= true*/)
{
    // We are going to parse the text again to validate the current grammar as Destructuring. Saving some scopes and
    // AST related information before the validation parsing and later they will be restored.

    ParseNodeFnc * pnodeFncSave = m_currentNodeFunc;
    ParseNodeFnc * pnodeDeferredFncSave = m_currentNodeDeferredFunc;
    if (m_currentNodeDeferredFunc == nullptr)
    {
        m_currentNodeDeferredFunc = m_currentNodeFunc;
    }
    int32 *pAstSizeSave = m_pCurrentAstSize;
    uint *pNestedCountSave = m_pnestedCount;
    ParseNodePtr *ppnodeScopeSave = m_ppnodeScope;
    ParseNodePtr *ppnodeExprScopeSave = m_ppnodeExprScope;

    ParseNodePtr newTempScope = nullptr;
    m_ppnodeScope = &newTempScope;

    int32 newTempAstSize = 0;
    m_pCurrentAstSize = &newTempAstSize;

    uint newTempNestedCount = 0;
    m_pnestedCount = &newTempNestedCount;

    m_ppnodeExprScope = nullptr;

    charcount_t funcInArraySave = m_funcInArray;
    uint funcInArrayDepthSave = m_funcInArrayDepth;

    // we need to reset this as we are going to parse the grammar again.
    m_hasDeferredShorthandInitError = false;

    ParseDestructuredLiteral<false>(declarationType, isDecl, topLevel, initializerContext, allowIn);

    m_currentNodeFunc = pnodeFncSave;
    m_currentNodeDeferredFunc = pnodeDeferredFncSave;
    m_pCurrentAstSize = pAstSizeSave;
    m_pnestedCount = pNestedCountSave;
    m_ppnodeScope = ppnodeScopeSave;
    m_ppnodeExprScope = ppnodeExprScopeSave;
    m_funcInArray = funcInArraySave;
    m_funcInArrayDepth = funcInArrayDepthSave;
}